

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O0

span<slang::parsing::Token,_18446744073709551615UL> __thiscall
slang::parsing::Preprocessor::MacroParser::parseTokenList(MacroParser *this,bool allowNewlines)

{
  SourceLocation location;
  string_view arg;
  span<slang::parsing::Token,_18446744073709551615UL> sVar1;
  bool bVar2;
  int iVar3;
  reference this_00;
  SourceLocation SVar4;
  Diagnostic *this_01;
  reference pTVar5;
  undefined4 extraout_var;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *src;
  size_t extraout_RDX_02;
  byte in_SIL;
  long *in_RDI;
  Token TVar6;
  TokenKind closeKind;
  TokenKind kind;
  SmallVector<slang::parsing::TokenKind,_20UL> delimPairStack;
  SmallVector<slang::parsing::Token,_16UL> tokens;
  Token *in_stack_fffffffffffffd78;
  Preprocessor *in_stack_fffffffffffffd80;
  TokenKind kind_00;
  undefined6 in_stack_fffffffffffffd88;
  TokenKind in_stack_fffffffffffffd8e;
  MacroParser *in_stack_fffffffffffffd90;
  DiagCode code;
  Token *in_stack_fffffffffffffdc8;
  char *pcVar7;
  byte local_202;
  byte local_201;
  TokenKind local_190;
  SmallVectorBase<slang::parsing::TokenKind> local_178 [2];
  SmallVectorBase<slang::parsing::Token> local_138 [7];
  byte local_19;
  pointer local_10;
  __extent_storage<18446744073709551615UL> local_8;
  
  local_19 = in_SIL & 1;
  SmallVector<slang::parsing::Token,_16UL>::SmallVector
            ((SmallVector<slang::parsing::Token,_16UL> *)0x3824f8);
  SmallVector<slang::parsing::TokenKind,_20UL>::SmallVector
            ((SmallVector<slang::parsing::TokenKind,_20UL> *)0x382505);
  while( true ) {
    TVar6 = peek((MacroParser *)in_stack_fffffffffffffd80);
    local_190 = TVar6.kind;
    local_201 = 1;
    if (local_190 != EndOfFile) {
      local_202 = 0;
      if ((local_19 & 1) == 0) {
        peek((MacroParser *)in_stack_fffffffffffffd80);
        bVar2 = Token::isOnSameLine(in_stack_fffffffffffffdc8);
        local_202 = bVar2 ^ 0xff;
      }
      local_201 = local_202;
    }
    if ((local_201 & 1) != 0) break;
    bVar2 = SmallVectorBase<slang::parsing::TokenKind>::empty(local_178);
    if (bVar2) {
      src = extraout_RDX_01;
      if ((local_190 == Comma) || (local_190 == CloseParenthesis)) goto LAB_0038280a;
    }
    else {
      pTVar5 = SmallVectorBase<slang::parsing::TokenKind>::back(local_178);
      if (*pTVar5 == local_190) {
        SmallVectorBase<slang::parsing::TokenKind>::pop_back
                  ((SmallVectorBase<slang::parsing::TokenKind> *)in_stack_fffffffffffffd80);
      }
    }
    TVar6 = consume(in_stack_fffffffffffffd90);
    in_stack_fffffffffffffd90 = (MacroParser *)TVar6.info;
    SmallVectorBase<slang::parsing::Token>::push_back
              ((SmallVectorBase<slang::parsing::Token> *)in_stack_fffffffffffffd80,
               in_stack_fffffffffffffd78);
    in_stack_fffffffffffffd8e = slang::syntax::SyntaxFacts::getDelimCloseKind(local_190);
    if (in_stack_fffffffffffffd8e != Unknown) {
      SmallVectorBase<slang::parsing::TokenKind>::push_back
                ((SmallVectorBase<slang::parsing::TokenKind> *)in_stack_fffffffffffffd80,
                 &in_stack_fffffffffffffd78->kind);
    }
  }
  bVar2 = SmallVectorBase<slang::parsing::TokenKind>::empty(local_178);
  code = SUB84((ulong)in_stack_fffffffffffffd90 >> 0x20,0);
  src = extraout_RDX;
  if (!bVar2) {
    pcVar7 = (char *)*in_RDI;
    this_00 = SmallVectorBase<slang::parsing::Token>::back(local_138);
    SVar4 = Token::location(this_00);
    location._6_2_ = in_stack_fffffffffffffd8e;
    location._0_6_ = in_stack_fffffffffffffd88;
    this_01 = addDiag(in_stack_fffffffffffffd80,code,location);
    kind_00 = (TokenKind)((ulong)in_stack_fffffffffffffd80 >> 0x30);
    SmallVectorBase<slang::parsing::TokenKind>::back(local_178);
    LexerFacts::getTokenKindText(kind_00);
    arg._M_str = pcVar7;
    arg._M_len = (size_t)SVar4;
    Diagnostic::operator<<(this_01,arg);
    src = extraout_RDX_00;
  }
LAB_0038280a:
  iVar3 = SmallVectorBase<slang::parsing::Token>::copy
                    (local_138,*(EVP_PKEY_CTX **)(*in_RDI + 8),src);
  local_10 = (pointer)CONCAT44(extraout_var,iVar3);
  local_8._M_extent_value = extraout_RDX_02;
  SmallVector<slang::parsing::TokenKind,_20UL>::~SmallVector
            ((SmallVector<slang::parsing::TokenKind,_20UL> *)0x382857);
  SmallVector<slang::parsing::Token,_16UL>::~SmallVector
            ((SmallVector<slang::parsing::Token,_16UL> *)0x382864);
  sVar1._M_extent._M_extent_value = local_8._M_extent_value;
  sVar1._M_ptr = local_10;
  return sVar1;
}

Assistant:

std::span<Token> Preprocessor::MacroParser::parseTokenList(bool allowNewlines) {
    SmallVector<Token, 16> tokens;
    SmallVector<TokenKind> delimPairStack;

    // Comma and right parenthesis only end the default token list if they are
    // not inside a nested pair of (), [], or {}, otherwise, keep swallowing
    // tokens as part of the list.
    while (true) {
        auto kind = peek().kind;
        if (kind == TokenKind::EndOfFile || (!allowNewlines && !peek().isOnSameLine())) {
            if (!delimPairStack.empty()) {
                pp.addDiag(diag::UnbalancedMacroArgDims, tokens.back().location())
                    << LF::getTokenKindText(delimPairStack.back());
            }
            break;
        }

        if (delimPairStack.empty()) {
            if (kind == TokenKind::Comma || kind == TokenKind::CloseParenthesis)
                break;
        }
        else if (delimPairStack.back() == kind) {
            delimPairStack.pop_back();
        }

        tokens.push_back(consume());

        TokenKind closeKind = SyntaxFacts::getDelimCloseKind(kind);
        if (closeKind != TokenKind::Unknown)
            delimPairStack.push_back(closeKind);
    }
    return tokens.copy(pp.alloc);
}